

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr_guarded.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::
lr_guarded<std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::mutex>
::
lr_guarded<std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (lr_guarded<std::shared_ptr<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::mutex>
           *this,shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *data)

{
  shared_ptr<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  shared_ptr<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  __integral_type_conflict1 __i;
  
  std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>::
  shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (in_RSI,(shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_RDI);
  std::
  shared_ptr<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::shared_ptr(in_RSI,in_RDI);
  __i = (__integral_type_conflict1)((ulong)in_RDI >> 0x20);
  CLI::std::atomic<bool>::atomic((atomic<bool> *)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  CLI::std::atomic<bool>::atomic((atomic<bool> *)in_RSI,SUB41((uint)__i >> 0x18,0));
  std::atomic<int>::atomic((atomic<int> *)in_RSI,__i);
  std::atomic<int>::atomic((atomic<int> *)in_RSI,__i);
  CLI::std::mutex::mutex((mutex *)0x3df210);
  return;
}

Assistant:

lr_guarded<T, M>::lr_guarded(Us&&... data):
    m_left(std::forward<Us>(data)...), m_right(m_left), m_readingLeft(true),
    m_countingLeft(true), m_leftReadCount(0), m_rightReadCount(0)
{
}